

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O1

bool __thiscall pjson::document::deserialize_start(document *this,uint8 *pStr)

{
  byte *pbVar1;
  byte bVar2;
  chunk *pcVar3;
  chunk *pcVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  byte *pbVar9;
  chunk *pcVar10;
  byte *pbVar11;
  
  (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p = (key_value_t *)0x0;
  (this->super_value_variant).super_value_variant_data.m_type = cJSONValueTypeNull;
  pcVar3 = (this->m_allocator).m_pActive_chunks;
  if (pcVar3 != (chunk *)0x0) {
    lVar6 = 0;
    pcVar4 = pcVar3;
    do {
      pcVar10 = pcVar4;
      lVar6 = lVar6 + pcVar10->m_size;
      pcVar10->m_ofs = 0;
      pcVar4 = pcVar10->m_pNext;
    } while (pcVar10->m_pNext != (chunk *)0x0);
    pcVar10->m_pNext = (this->m_allocator).m_pFree_chunks;
    (this->m_allocator).m_pFree_chunks = pcVar3;
    (this->m_allocator).m_pActive_chunks = (chunk *)0x0;
    uVar7 = lVar6 + (this->m_allocator).m_total_free_bytes;
    (this->m_allocator).m_total_free_bytes = uVar7;
    while ((this->m_allocator).m_max_to_preserve_across_resets < uVar7) {
      pcVar3 = (this->m_allocator).m_pFree_chunks;
      if (pcVar3 == (chunk *)0x0) {
        __assert_fail("m_pFree_chunks",
                      "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                      ,0x120,"void pjson::pool_allocator::reset()");
      }
      if (uVar7 < pcVar3->m_size) {
        __assert_fail("m_total_free_bytes >= m_pFree_chunks->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                      ,0x122,"void pjson::pool_allocator::reset()");
      }
      pcVar4 = pcVar3->m_pNext;
      (this->m_allocator).m_total_free_bytes = uVar7 - pcVar3->m_size;
      free(pcVar3);
      (this->m_allocator).m_pFree_chunks = pcVar4;
      uVar7 = (this->m_allocator).m_total_free_bytes;
    }
    (this->m_allocator).m_cur_grow_size = (this->m_allocator).m_min_chunk_size;
  }
  this->m_pStart = pStr;
  pbVar9 = pStr;
LAB_00104c01:
  while( true ) {
    while (bVar2 = *pbVar9, 0x1f < bVar2) {
      if (bVar2 != 0x2f) {
        pbVar11 = pbVar9;
        if (bVar2 == 0x20) goto LAB_00104c1f;
        goto LAB_00104c4d;
      }
      if (pbVar9[1] != 0x2f) goto LAB_00104c4d;
      pbVar9 = pbVar9 + 2;
      while ((0xd < *pbVar9 || ((0x2401U >> (*pbVar9 & 0x1f) & 1) == 0))) {
        pbVar9 = pbVar9 + 1;
      }
    }
    pbVar11 = pbVar9;
    if (bVar2 != 9) break;
LAB_00104c1f:
    do {
      pbVar9 = pbVar11 + 1;
      pbVar1 = pbVar11 + 1;
      pbVar11 = pbVar9;
    } while (*pbVar1 == bVar2);
  }
  if (bVar2 != 0) {
LAB_00104c4d:
    if (0x20 < bVar2) goto LAB_00104c57;
    pbVar9 = pbVar9 + 1;
    goto LAB_00104c01;
  }
LAB_00104c57:
  this->m_pStr = pbVar9;
  bVar2 = *pbVar9;
  if ((bVar2 == 0x7b) || (bVar2 == 0x5b)) {
    (this->super_value_variant).super_value_variant_data.m_type =
         (bVar2 == 0x7b) + cJSONValueTypeArray;
    (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p = (key_value_t *)0x0;
    *(undefined8 *)((long)&(this->super_value_variant).super_value_variant_data.m_data + 8) = 0;
    bVar5 = deserialize_internal(this);
    if (!bVar5) {
      return bVar5;
    }
    pbVar9 = this->m_pStr;
LAB_00104cb5:
    while( true ) {
      while (bVar2 = *pbVar9, 0x1f < bVar2) {
        if (bVar2 != 0x2f) {
          pbVar11 = pbVar9;
          if (bVar2 == 0x20) goto LAB_00104cd3;
          goto LAB_00104d01;
        }
        if (pbVar9[1] != 0x2f) goto LAB_00104d01;
        pbVar9 = pbVar9 + 2;
        while ((0xd < *pbVar9 || ((0x2401U >> (*pbVar9 & 0x1f) & 1) == 0))) {
          pbVar9 = pbVar9 + 1;
        }
      }
      pbVar11 = pbVar9;
      if (bVar2 != 9) break;
LAB_00104cd3:
      do {
        pbVar9 = pbVar11 + 1;
        pbVar1 = pbVar11 + 1;
        pbVar11 = pbVar9;
      } while (*pbVar1 == bVar2);
    }
    if (bVar2 != 0) {
LAB_00104d01:
      if (0x20 < bVar2) goto LAB_00104d0b;
      pbVar9 = pbVar9 + 1;
      goto LAB_00104cb5;
    }
LAB_00104d0b:
    this->m_pStr = pbVar9;
    if (*pbVar9 == 0) {
      return *pbVar9 == 0;
    }
    this->m_pStr = pbVar9;
    pStr = this->m_pStart;
    pcVar8 = "Unknown data at end of document";
  }
  else if (bVar2 == 0) {
    this->m_pStr = pbVar9;
    pcVar8 = "Nothing to deserialize";
  }
  else {
    this->m_pStr = pbVar9;
    pcVar8 = "Root value must be an object or array";
  }
  (this->m_error_info).m_ofs = (long)pbVar9 - (long)pStr;
  (this->m_error_info).m_pError_message = pcVar8;
  return false;
}

Assistant:

bool deserialize_start(uint8* pStr)
      {
         set_to_null();

#if PJSON_PARSE_STATS
         m_parse_stats.clear();
#endif

         m_allocator.reset();

         m_pStart = pStr;
         
         m_pStr = skip_whitespace(pStr);
         
         if (!*m_pStr)
            return set_error(m_pStr, "Nothing to deserialize");

         bool success = false;

         uint8 c = *m_pStr;
         if ((c == '{') || (c == '['))
         {
            set_to_node(c == '{'); PJSON_INCREMENT_STAT(m_num_control);
            success = deserialize_internal();
         }
         else
            return set_error(m_pStr, "Root value must be an object or array");

         if (success)
         {
            m_pStr = skip_whitespace(m_pStr);
            success = !*m_pStr;
            if (!success)
               set_error(m_pStr, "Unknown data at end of document");
         }

         return success;
      }